

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test10::compare
          (GPUShaderFP64Test10 *this,_variable_type type,GLvoid *left,GLvoid *right)

{
  double val;
  double val_00;
  uint uVar1;
  _variable_type _Var2;
  GLuint GVar3;
  TestError *this_00;
  double dVar4;
  GLuint right_value_2;
  GLuint left_value_2;
  GLuint component_2;
  GLuint *right_values_2;
  GLuint *left_values_2;
  GLint right_value_1;
  GLint left_value_1;
  GLuint component_1;
  GLint *right_values_1;
  GLint *left_values_1;
  GLdouble right_value;
  GLdouble left_value;
  GLuint component;
  GLdouble *right_values;
  GLdouble *left_values;
  _variable_type base_type;
  GLuint n_components;
  bool result;
  GLvoid *right_local;
  GLvoid *left_local;
  _variable_type type_local;
  GPUShaderFP64Test10 *this_local;
  
  uVar1 = Utils::getNumberOfComponentsForVariableType(type);
  _Var2 = Utils::getBaseVariableType(type);
  if (_Var2 == VARIABLE_TYPE_DOUBLE) {
    for (left_value._4_4_ = 0; left_value._4_4_ < uVar1; left_value._4_4_ = left_value._4_4_ + 1) {
      val = *(double *)((long)left + (ulong)left_value._4_4_ * 8);
      val_00 = *(double *)((long)right + (ulong)left_value._4_4_ * 8);
      if ((((val != val_00) || (NAN(val) || NAN(val_00))) &&
          (dVar4 = de::abs<double>(val - val_00), 2e-05 < dVar4)) &&
         ((GVar3 = Math::isnan_impl(val), GVar3 == 0 &&
          (GVar3 = Math::isnan_impl(val_00), GVar3 == 0)))) {
        return false;
      }
    }
  }
  else if (_Var2 == VARIABLE_TYPE_INT) {
    for (right_value_1 = 0; (uint)right_value_1 < uVar1; right_value_1 = right_value_1 + 1) {
      if (*(int *)((long)left + (ulong)(uint)right_value_1 * 4) !=
          *(int *)((long)right + (ulong)(uint)right_value_1 * 4)) {
        return false;
      }
    }
  }
  else {
    if (_Var2 != VARIABLE_TYPE_UINT) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x353d);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    for (right_value_2 = 0; right_value_2 < uVar1; right_value_2 = right_value_2 + 1) {
      if (*(int *)((long)left + (ulong)right_value_2 * 4) !=
          *(int *)((long)right + (ulong)right_value_2 * 4)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool GPUShaderFP64Test10::compare(Utils::_variable_type type, const glw::GLvoid* left, const glw::GLvoid* right)
{
	bool result = true;

	const glw::GLuint			n_components = Utils::getNumberOfComponentsForVariableType(type);
	const Utils::_variable_type base_type	= Utils::getBaseVariableType(type);

	switch (base_type)
	{
	case Utils::VARIABLE_TYPE_DOUBLE:

	{
		const glw::GLdouble* left_values  = (glw::GLdouble*)left;
		const glw::GLdouble* right_values = (glw::GLdouble*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLdouble left_value  = left_values[component];
			const glw::GLdouble right_value = right_values[component];

			if ((left_value != right_value) && (m_epsilon < de::abs(left_value - right_value)) &&
				(0 == Math::isnan_impl(left_value)) && (0 == Math::isnan_impl(right_value)))
			{
				result = false;
				break;
			}
		}
	}

	break;

	case Utils::VARIABLE_TYPE_INT:

	{
		const glw::GLint* left_values  = (glw::GLint*)left;
		const glw::GLint* right_values = (glw::GLint*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLint left_value  = left_values[component];
			const glw::GLint right_value = right_values[component];

			if (left_value != right_value)
			{
				result = false;
				break;
			}
		}
	}

	break;

	case Utils::VARIABLE_TYPE_UINT:

	{
		const glw::GLuint* left_values  = (glw::GLuint*)left;
		const glw::GLuint* right_values = (glw::GLuint*)right;

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLuint left_value  = left_values[component];
			const glw::GLuint right_value = right_values[component];

			if (left_value != right_value)
			{
				result = false;
				break;
			}
		}
	}

	break;

	default:

		TCU_FAIL("Not implemented");

		break;
	}

	return result;
}